

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O0

void __thiscall tonk::UDPSocket::postNextRead(UDPSocket *this,uint8_t *readBuffer)

{
  mutable_buffers_1 *in_RSI;
  endpoint_type *in_RDI;
  mutable_buffers_1 mVar1;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff98;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffb0;
  
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint((basic_endpoint<asio::ip::udp> *)0x18b462)
  ;
  asio::ip::basic_endpoint<asio::ip::udp>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                *)0x18b489);
  mVar1 = asio::buffer(in_stack_ffffffffffffffb0,(size_t)in_RDI);
  asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  async_receive_from<asio::mutable_buffers_1,tonk::UDPSocket::postNextRead(unsigned_char*)::__0>
            ((basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)
             mVar1.super_mutable_buffer.data_,in_RSI,in_RDI,(anon_class_16_2_48e8bdf1 *)in_RDI);
  return;
}

Assistant:

void UDPSocket::postNextRead(uint8_t* readBuffer)
{
    // Clear source address to allow us to check if it's filled later
    // during error handling
    SourceAddress = UDPAddress();

    TONK_IF_DEBUG(++OutstandingRecvs);

    // Dispatch asynchronous recvfrom()
    Socket->async_receive_from(
        asio::buffer(readBuffer, kReadBufferBytes),
        SourceAddress,
        [this, readBuffer](const asio::error_code& error, size_t bytes_transferred)
    {
        // Grab the receive timestamp right away
        const uint64_t receiveUsec = siamese::GetTimeUsec();

        TONK_IF_DEBUG(--OutstandingRecvs);

        uint8_t* nextReadBuffer = readBuffer;

        // If there was an error reported:
        if (error)
        {
            // If no source address was provided:
            if (SourceAddress.address().is_unspecified())
            {
                if (!SocketClosed) {
                    Deps.Logger->Warning("Socket receive failed unexpectedly");
                }

                Deps.SocketRefCount->StartShutdown(
                    Tonk_NetworkFailed,
                    Result("async_receive_from failed",
                        error.message(),
                        ErrorType::Asio,
                        error.value()));

                // Note this stops posting read requests
                Deps.SocketRefCount->DecrementReferences();

                return;
            }

            // Otherwise we assume it is due to ICMP message from a peer:

            // Handle peer-specific failure that is not catastrophic
            IConnection* icon = AddressMap.FindByAddr(SourceAddress);
            if (icon) {
                Connection* connection = reinterpret_cast<Connection*>(icon);
                connection->OnICMPError(error);
            }

            // Fall-thru to continue reading datagrams
        }
        else if (bytes_transferred <= 0)
        {
            if (!SocketClosed) {
                Deps.Logger->Warning("Socket closed unexpectedly");
            }

            // Start shutdown
            Deps.SocketRefCount->StartShutdown(Tonk_NetworkFailed, Result("UDP socket closed", "Socket closed", ErrorType::Tonk, Tonk_NetworkFailed));

            // Note no read request is posted here
            Deps.SocketRefCount->DecrementReferences();

            return;
        }
        else
        {
#ifdef TONK_FOIL_BUFFER_STEALING
            // Clear remaining receive buffer to foil buffer-stealing attacks
            memset(buffer + bytes_transferred, 0xfe, bufferBytes - bytes_transferred);
#endif

#ifdef TONK_ENABLE_ARTIFICIAL_PACKETLOSS
            if (m_ArtificialPacketlossThreshold > 0)
            {
                const uint32_t word = ArtificialPacketlossPRNG.Next() & 0x7fffffff;
                if (word < m_ArtificialPacketlossThreshold)
                {
                    //ModuleLogger.Trace("ARTIFICAL DROPPED DATAGRAM HERE");

                    // Reuse the same read buffer to post another read request
                    postNextRead(nextReadBuffer);

                    return; // Do not handle this datagram
                }
            }
#endif // TONK_ENABLE_ARTIFICIAL_PACKETLOSS

            TONK_DEBUG_ASSERT(bytes_transferred <= kReadBufferBytes);
            const unsigned receivedBytes = static_cast<unsigned>(bytes_transferred);

            const BufferResult result = onUDPDatagram(
                receiveUsec,
                SourceAddress,
                readBuffer,
                receivedBytes);

            if (result == BufferResult::InUse) {
                // Allocate a new buffer for the next read
                nextReadBuffer = Deps.ReadBufferAllocator->Allocate(kReadBufferBytes);
            }
        }

        // Post next read buffer
        postNextRead(nextReadBuffer);
    });
}